

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall
ccs::no_such_property::no_such_property(no_such_property *this,string *name,CcsContext *context)

{
  ostream *poVar1;
  string local_1d8 [32];
  CcsContext local_1b8 [2];
  ostringstream local_198 [8];
  ostringstream str;
  CcsContext *context_local;
  string *name_local;
  no_such_property *this_local;
  
  std::exception::exception((exception *)this);
  *(undefined ***)this = &PTR__no_such_property_00266930;
  *(undefined ***)this = &PTR__no_such_property_00266930;
  std::__cxx11::string::string((string *)&this->msg);
  CcsContext::CcsContext(&this->context,context);
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"no such property: \'");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"\' (in context: ");
  CcsContext::CcsContext(local_1b8,context);
  poVar1 = ccs::operator<<(poVar1,local_1b8);
  std::operator<<(poVar1,")");
  CcsContext::~CcsContext(local_1b8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->msg,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

no_such_property::no_such_property(const std::string &name, CcsContext context)
  : context(context) {
  std::ostringstream str;
  str << "no such property: '" << name << "' (in context: " << context << ")";
  msg = str.str();
}